

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int server_collected_extensions
              (ptls_t *tls,ptls_handshake_properties_t *properties,ptls_raw_extension_t *slots)

{
  ptls_iovec_t vec;
  ushort uVar1;
  int iVar2;
  quicly_conn_t *conn_00;
  short *in_RDX;
  long in_RSI;
  uint16_t size;
  uint8_t *end;
  uint8_t *src;
  int ret;
  quicly_cid_t initial_scid;
  quicly_conn_t *conn;
  void *in_stack_00000288;
  quicly_cid_t *in_stack_00000290;
  quicly_cid_t *in_stack_00000298;
  quicly_cid_t *in_stack_000002a0;
  quicly_transport_parameters_t *in_stack_000002a8;
  ptls_buffer_t *in_stack_000002b0;
  size_t in_stack_000002c0;
  quicly_cid_t *smallbuf;
  undefined4 in_stack_fffffffffffffed4;
  uint8_t *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  undefined1 local_98 [2];
  undefined6 uStack_96;
  uint8_t *local_90;
  size_t local_88;
  undefined2 local_80;
  undefined6 uStack_7e;
  undefined8 local_78;
  undefined8 local_70;
  undefined6 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffffa0 [16];
  quicly_cid_t *initial_scid_00;
  quicly_cid_t *original_dcid;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  undefined1 local_35 [5];
  uint8_t *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  byte local_21;
  
  conn_00 = (quicly_conn_t *)(in_RSI + -0x8b8);
  if (*in_RDX == -1) {
    iVar3 = 0x6d;
  }
  else {
    if (*in_RDX != -0x5b) {
      __assert_fail("slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x8fa,
                    "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    if (in_RDX[0xc] != -1) {
      __assert_fail("slots[1].type == UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x8fb,
                    "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    original_dcid = *(quicly_cid_t **)(in_RDX + 4);
    smallbuf = (quicly_cid_t *)(original_dcid->cid + *(long *)(in_RDX + 8));
    needs_cid_auth(conn_00);
    needs_cid_auth(conn_00);
    needs_cid_auth(conn_00);
    initial_scid_00 = smallbuf;
    iVar2 = recognize_delayed_ack(conn_00);
    iVar3 = quicly_decode_transport_parameter_list
                      ((quicly_transport_parameters_t *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),original_dcid,
                       initial_scid_00,in_stack_ffffffffffffffa0._8_8_,
                       in_stack_ffffffffffffffa0._0_8_,
                       (uint8_t *)CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
    if (iVar3 == 0) {
      iVar3 = needs_cid_auth(conn_00);
      if (iVar3 != 0) {
        ptls_iovec_init(local_35,(ulong)local_21);
        vec.len = in_stack_fffffffffffffee0;
        vec.base = in_stack_fffffffffffffed8;
        iVar3 = quicly_cid_is_equal((quicly_cid_t *)CONCAT44(in_stack_fffffffffffffed4,iVar2),vec);
        if (iVar3 == 0) {
          return 0x2000a;
        }
      }
      ack_frequency_set_next_update_at((quicly_conn_t *)CONCAT44(in_stack_fffffffffffffed4,iVar2));
      if (*(long *)(in_RSI + -0x388) == 0) {
        __assert_fail("conn->initial != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x910,
                      "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                     );
      }
      if (*(ushort *)(in_RSI + -0x250) < *(ushort *)(*(long *)(in_RSI + -0x388) + 0x68)) {
        uVar1 = *(ushort *)(*(long *)(in_RSI + -0x388) + 0x68);
        if (*(ulong *)(in_RSI + -0x5f0) < (ulong)uVar1) {
          uVar1 = (ushort)*(undefined8 *)(in_RSI + -0x5f0);
        }
        if ((((conn_00->super).ctx)->transport_params).max_udp_payload_size < (ulong)uVar1) {
          uVar1 = (ushort)(((conn_00->super).ctx)->transport_params).max_udp_payload_size;
        }
        *(ushort *)(in_RSI + -0x250) = uVar1;
      }
      if (*(long *)(in_RSI + 0x68) != 0) {
        __assert_fail("properties->additional_extensions == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x91b,
                      "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                     );
      }
      ptls_buffer_init((ptls_buffer_t *)CONCAT44(in_stack_fffffffffffffed4,iVar2),smallbuf,0x13c02e)
      ;
      if (*(long *)(in_RSI + -0x890) != 0) {
        __assert_fail("conn->super.local.cid_set.cids[0].sequence == 0 && \"make sure that local_cid is in expected state before sending SRT\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x91d,
                      "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                     );
      }
      iVar3 = needs_cid_auth(conn_00);
      if (iVar3 == 0) {
        is_retry(conn_00);
      }
      needs_cid_auth(conn_00);
      iVar3 = needs_cid_auth(conn_00);
      if (iVar3 != 0) {
        is_retry(conn_00);
      }
      iVar3 = quicly_encode_transport_parameter_list
                        (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                         in_stack_00000290,in_stack_00000288,in_stack_000002c0);
      if (iVar3 == 0) {
        *(long *)(in_RSI + 0x68) = in_RSI + 0x80;
        local_80 = 0xffa5;
        local_78 = *(undefined8 *)(in_RSI + 0xb0);
        local_70 = *(undefined8 *)(in_RSI + 0xc0);
        *(ulong *)(in_RSI + 0x80) = CONCAT62(uStack_7e,0xffa5);
        *(undefined8 *)(in_RSI + 0x88) = local_78;
        *(undefined8 *)(in_RSI + 0x90) = local_70;
        memset(local_98,0,0x18);
        *(ulong *)((conn_00->crypto).transport_params.ext + 1) = CONCAT62(uStack_96,0xffff);
        (conn_00->crypto).transport_params.ext[1].data.base = local_90;
        (conn_00->crypto).transport_params.ext[1].data.len = local_88;
        *(long *)(in_RSI + 0x68) = in_RSI + 0x80;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int server_collected_extensions(ptls_t *tls, ptls_handshake_properties_t *properties, ptls_raw_extension_t *slots)
{
    quicly_conn_t *conn = (void *)((char *)properties - offsetof(quicly_conn_t, crypto.handshake_properties));
    quicly_cid_t initial_scid;
    int ret;

    if (slots[0].type == UINT16_MAX) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }
    assert(slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS);
    assert(slots[1].type == UINT16_MAX);

    { /* decode transport_parameters extension */
        const uint8_t *src = slots[0].data.base, *end = src + slots[0].data.len;
        if ((ret = quicly_decode_transport_parameter_list(
                 &conn->super.remote.transport_params, needs_cid_auth(conn) ? NULL : &tp_cid_ignore,
                 needs_cid_auth(conn) ? &initial_scid : &tp_cid_ignore, needs_cid_auth(conn) ? NULL : &tp_cid_ignore, NULL, src,
                 end, recognize_delayed_ack(conn))) != 0)
            goto Exit;
        if (needs_cid_auth(conn) &&
            !quicly_cid_is_equal(&conn->super.remote.cid_set.cids[0].cid, ptls_iovec_init(initial_scid.cid, initial_scid.len))) {
            ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            goto Exit;
        }
    }

    /* setup ack frequency */
    ack_frequency_set_next_update_at(conn);

    /* update UDP max payload size to:
     * max(current, min(max_the_remote_sent, remote.tp.max_udp_payload_size, local.tp.max_udp_payload_size)) */
    assert(conn->initial != NULL);
    if (conn->egress.max_udp_payload_size < conn->initial->largest_ingress_udp_payload_size) {
        uint16_t size = conn->initial->largest_ingress_udp_payload_size;
        if (size > conn->super.remote.transport_params.max_udp_payload_size)
            size = conn->super.remote.transport_params.max_udp_payload_size;
        if (size > conn->super.ctx->transport_params.max_udp_payload_size)
            size = conn->super.ctx->transport_params.max_udp_payload_size;
        conn->egress.max_udp_payload_size = size;
    }

    /* set transport_parameters extension to be sent in EE */
    assert(properties->additional_extensions == NULL);
    ptls_buffer_init(&conn->crypto.transport_params.buf, "", 0);
    assert(conn->super.local.cid_set.cids[0].sequence == 0 && "make sure that local_cid is in expected state before sending SRT");
    if ((ret = quicly_encode_transport_parameter_list(
             &conn->crypto.transport_params.buf, &conn->super.ctx->transport_params,
             needs_cid_auth(conn) || is_retry(conn) ? &conn->super.original_dcid : NULL,
             needs_cid_auth(conn) ? &conn->super.local.cid_set.cids[0].cid : NULL,
             needs_cid_auth(conn) && is_retry(conn) ? &conn->retry_scid : NULL,
             conn->super.ctx->cid_encryptor != NULL ? conn->super.local.cid_set.cids[0].stateless_reset_token : NULL, 0)) != 0)
        goto Exit;
    properties->additional_extensions = conn->crypto.transport_params.ext;
    conn->crypto.transport_params.ext[0] =
        (ptls_raw_extension_t){QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS,
                               {conn->crypto.transport_params.buf.base, conn->crypto.transport_params.buf.off}};
    conn->crypto.transport_params.ext[1] = (ptls_raw_extension_t){UINT16_MAX};
    conn->crypto.handshake_properties.additional_extensions = conn->crypto.transport_params.ext;

    ret = 0;

Exit:
    return ret;
}